

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O1

UBool __thiscall icu_63::PluralFormat::operator==(PluralFormat *this,Format *other)

{
  NumberFormat *pNVar1;
  PluralRules *pPVar2;
  UBool UVar3;
  int iVar4;
  bool bVar5;
  
  if (this == (PluralFormat *)other) {
    return '\x01';
  }
  UVar3 = Format::operator==(&this->super_Format,other);
  if ((((UVar3 != '\0') &&
       (UVar3 = Locale::operator==(&this->locale,(Locale *)(other + 1)), UVar3 != '\0')) &&
      (UVar3 = MessagePattern::operator==
                         (&this->msgPattern,(MessagePattern *)(other[1].validLocale + 0x3b)),
      UVar3 != '\0')) &&
     ((pNVar1 = this->numberFormat,
      (pNVar1 == (NumberFormat *)0x0) != (*(long *)(other[2].actualLocale + 0x10) != 0) &&
      ((pNVar1 == (NumberFormat *)0x0 ||
       (iVar4 = (*(pNVar1->super_Format).super_UObject._vptr_UObject[3])(), (char)iVar4 != '\0')))))
     ) {
    pPVar2 = (this->pluralRulesWrapper).pluralRules;
    bVar5 = *(long *)(other[2].actualLocale + 0x28) == 0;
    if (pPVar2 == (PluralRules *)0x0 || bVar5) {
      return (pPVar2 == (PluralRules *)0x0) == bVar5;
    }
    iVar4 = (*(pPVar2->super_UObject)._vptr_UObject[3])();
    return (char)iVar4 != '\0';
  }
  return '\0';
}

Assistant:

UBool
PluralFormat::operator==(const Format& other) const {
    if (this == &other) {
        return TRUE;
    }
    if (!Format::operator==(other)) {
        return FALSE;
    }
    const PluralFormat& o = (const PluralFormat&)other;
    return
        locale == o.locale &&
        msgPattern == o.msgPattern &&  // implies same offset
        (numberFormat == NULL) == (o.numberFormat == NULL) &&
        (numberFormat == NULL || *numberFormat == *o.numberFormat) &&
        (pluralRulesWrapper.pluralRules == NULL) == (o.pluralRulesWrapper.pluralRules == NULL) &&
        (pluralRulesWrapper.pluralRules == NULL ||
            *pluralRulesWrapper.pluralRules == *o.pluralRulesWrapper.pluralRules);
}